

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O2

QFunctionsDiscrete * __thiscall
AlphaVectorPlanning::Prune
          (QFunctionsDiscrete *__return_storage_ptr__,AlphaVectorPlanning *this,
          QFunctionsDiscrete *Q)

{
  pointer pvVar1;
  uint uVar2;
  ulong uVar3;
  ValueFunctionPOMDPDiscrete VStack_48;
  
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector(__return_storage_ptr__,
           ((long)(Q->
                  super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
           (long)(Q->
                 super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&VStack_48);
  uVar2 = 0;
  while( true ) {
    pvVar1 = (Q->
             super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (ulong)uVar2;
    if (((long)(Q->
               super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18 == uVar3) break;
    Prune(&VStack_48,this,pvVar1 + uVar3);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::_M_move_assign
              ((__return_storage_ptr__->
               super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar3,&VStack_48);
    std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&VStack_48);
    uVar2 = uVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

QFunctionsDiscrete AlphaVectorPlanning::Prune(const QFunctionsDiscrete &Q) const
{
    QFunctionsDiscrete Q1(Q.size());
    size_t nrAlphas=0;

#if 0
    cout << "Calling Cassandra's pomdp-tools for pruning a Q-value function of size <";
    for(Index a=0;a!=Q.size();++a)
        cout << " " << Q[a].size();
    cout << " >" << endl;
#endif

    for(Index a=0;a!=Q.size();++a)
    {

#if DEBUG_AlphaVectorPlanning_Prune
//        cout << "AlphaVectorPlanning::Prune for action " << a << ": " << Q.size() << " vectors" << endl;
#endif
        Q1[a]=Prune(Q[a]);
        nrAlphas+=Q1[a].size();
        
    }

#if DEBUG_AlphaVectorPlanning_Prune
        cout << "AlphaVectorPlanning::Prune for action " << a << ": reduced "
             << Q[a].size() << " to " 
             << Q1[a].size()
             << " (total #vectors: " << nrAlphas << ")" << endl;
#endif

    return(Q1);
}